

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall icu_63::VTimeZone::writeFooter(VTimeZone *this,VTZWriter *writer,UErrorCode *status)

{
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  VTZWriter::write(writer,0x37cad2,status,in_RCX);
  VTZWriter::write(writer,0x3a,__buf,in_RCX);
  VTZWriter::write(writer,0x37ca50,__buf_00,in_RCX);
  VTZWriter::write(writer,0x37cb4e,__buf_01,in_RCX);
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }